

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O0

void __thiscall
TPZNonLinMultGridAnalysis::CoutTime(TPZNonLinMultGridAnalysis *this,clock_t *start,char *title)

{
  clock_t cVar1;
  ostream *poVar2;
  long lVar3;
  void *this_00;
  char *in_RDX;
  long *in_RSI;
  clock_t segundos;
  clock_t end;
  
  cVar1 = clock();
  poVar2 = std::operator<<((ostream *)&std::cout,in_RDX);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  lVar3 = (cVar1 - *in_RSI) / 1000000;
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,lVar3);
  poVar2 = std::operator<<(poVar2," segundos");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(double)lVar3 / 60.0);
  poVar2 = std::operator<<(poVar2," minutos");
  this_00 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZNonLinMultGridAnalysis::CoutTime(clock_t &start,const char *title){
    clock_t end = clock();
    cout << title <<  endl;
    clock_t segundos = ((end - start)/CLOCKS_PER_SEC);
    cout << segundos << " segundos" << endl;
    cout << segundos/60.0 << " minutos" << endl << endl;
}